

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsystemtrayicon.cpp
# Opt level: O0

void __thiscall QBalloonTip::balloon(QBalloonTip *this,QPoint *pos,int msecs,bool showArrow)

{
  bool bVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  QColor *pQVar8;
  byte in_CL;
  int in_EDX;
  QPoint *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  undefined1 auVar9 [16];
  int mb;
  int mt;
  int mr;
  int ml;
  bool arrowAtLeft;
  bool arrowAtTop;
  int rc;
  int aw;
  int ao;
  int ah;
  int border;
  QScreen *screen;
  QPainter painter2;
  QPainter painter1;
  QBitmap bitmap;
  QPainterPath path;
  QSize sz;
  QSize sh;
  QRect screenRect;
  int in_stack_fffffffffffffcf8;
  ColorRole in_stack_fffffffffffffcfc;
  QWidget *in_stack_fffffffffffffd00;
  duration<long,_std::ratio<1L,_1000000000L>_> *this_00;
  QRect *in_stack_fffffffffffffd08;
  Duration duration;
  QWidget *in_stack_fffffffffffffd10;
  QWidget *this_01;
  undefined4 in_stack_fffffffffffffd18;
  undefined4 in_stack_fffffffffffffd1c;
  undefined4 uVar10;
  undefined4 local_1c8;
  undefined2 uStack_1c4;
  QBrush local_1c0 [8];
  QPen local_1b8 [8];
  undefined1 *local_1b0;
  QPixmap local_1a8 [24];
  QBrush local_190 [8];
  QBrush local_188 [8];
  QPen local_180 [8];
  undefined1 *local_178;
  undefined8 local_170;
  undefined4 local_168;
  undefined4 uStack_164;
  undefined4 uStack_160;
  undefined4 uStack_15c;
  undefined1 *local_158;
  QRect local_120;
  QWidget local_110;
  int local_e8;
  int local_e4 [25];
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  undefined1 *local_70;
  undefined1 *local_64;
  undefined8 local_5c;
  undefined1 *local_54;
  undefined1 local_4c [16];
  int local_3c;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined4 local_20;
  undefined2 local_1c;
  QColor local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = in_CL & 1;
  *(byte *)((long)in_RDI + 0x4c) = bVar3;
  local_3c = in_EDX;
  lVar7 = QGuiApplication::screenAt(in_RSI);
  if (lVar7 == 0) {
    QGuiApplication::primaryScreen();
  }
  local_4c._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_4c._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_4c = QScreen::geometry();
  local_54 = &DAT_aaaaaaaaaaaaaaaa;
  local_54 = (undefined1 *)(**(code **)(*in_RDI + 0x70))();
  iVar4 = QPoint::y((QPoint *)0x4904ec);
  iVar5 = QSize::height((QSize *)0x490500);
  iVar6 = QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
  bVar1 = iVar4 + iVar5 + 0x12 < iVar6;
  iVar4 = QPoint::x((QPoint *)0x490546);
  iVar5 = QSize::width((QSize *)0x49055a);
  iVar6 = QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
  bVar2 = iVar4 + iVar5 + -0x12 < iVar6;
  QWidget::setContentsMargins
            (in_stack_fffffffffffffd10,(int)((ulong)in_stack_fffffffffffffd08 >> 0x20),
             (int)in_stack_fffffffffffffd08,(int)((ulong)in_stack_fffffffffffffd00 >> 0x20),
             (int)in_stack_fffffffffffffd00);
  QWidget::updateGeometry(in_stack_fffffffffffffd00);
  local_5c = (**(code **)(*in_RDI + 0x70))();
  local_64 = &DAT_aaaaaaaaaaaaaaaa;
  local_54 = (undefined1 *)local_5c;
  local_64 = (undefined1 *)(**(code **)(*in_RDI + 0x70))();
  if (bVar1) {
    QSize::width((QSize *)0x4906d9);
    QSize::height((QSize *)0x4906f0);
  }
  else {
    QSize::width((QSize *)0x490690);
    QSize::height((QSize *)0x4906a7);
  }
  local_70 = &DAT_aaaaaaaaaaaaaaaa;
  QPainterPath::QPainterPath((QPainterPath *)&local_70);
  QPainterPath::moveTo
            ((QPainterPath *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
             (qreal)in_stack_fffffffffffffd10,(qreal)in_stack_fffffffffffffd08);
  if ((bVar1) && (bVar2)) {
    if (bVar3 != 0) {
      QPainterPath::lineTo
                ((QPainterPath *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                 (qreal)in_stack_fffffffffffffd10,(qreal)in_stack_fffffffffffffd08);
      QPainterPath::lineTo
                ((QPainterPath *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                 (qreal)in_stack_fffffffffffffd10,(qreal)in_stack_fffffffffffffd08);
      QPainterPath::lineTo
                ((QPainterPath *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                 (qreal)in_stack_fffffffffffffd10,(qreal)in_stack_fffffffffffffd08);
    }
    local_74 = QPoint::x((QPoint *)0x4907e1);
    local_74 = local_74 + -0x12;
    local_78 = QRect::left((QRect *)0x4907f8);
    local_78 = local_78 + 2;
    qMax<int>(&local_74,&local_78);
    QPoint::y((QPoint *)0x49082d);
    QWidget::move(in_stack_fffffffffffffd10,(int)((ulong)in_stack_fffffffffffffd08 >> 0x20),
                  (int)in_stack_fffffffffffffd08);
  }
  else if ((bVar1) && (!bVar2)) {
    if (bVar3 != 0) {
      QPainterPath::lineTo
                ((QPainterPath *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                 (qreal)in_stack_fffffffffffffd10,(qreal)in_stack_fffffffffffffd08);
      QPainterPath::lineTo
                ((QPainterPath *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                 (qreal)in_stack_fffffffffffffd10,(qreal)in_stack_fffffffffffffd08);
      QPainterPath::lineTo
                ((QPainterPath *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                 (qreal)in_stack_fffffffffffffd10,(qreal)in_stack_fffffffffffffd08);
    }
    iVar4 = QPoint::x((QPoint *)0x4908ef);
    iVar5 = QSize::width((QSize *)0x490903);
    local_7c = (iVar4 - iVar5) + 0x12;
    iVar4 = QRect::right((QRect *)0x490925);
    iVar5 = QSize::width((QSize *)0x490939);
    local_80 = (iVar4 - iVar5) + -2;
    qMin<int>(&local_7c,&local_80);
    QPoint::y((QPoint *)0x490979);
    QWidget::move(in_stack_fffffffffffffd10,(int)((ulong)in_stack_fffffffffffffd08 >> 0x20),
                  (int)in_stack_fffffffffffffd08);
  }
  QPainterPath::lineTo
            ((QPainterPath *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
             (qreal)in_stack_fffffffffffffd10,(qreal)in_stack_fffffffffffffd08);
  QRect::QRect(in_stack_fffffffffffffd08,(int)((ulong)in_stack_fffffffffffffd00 >> 0x20),
               (int)in_stack_fffffffffffffd00,in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8);
  QRectF::QRectF((QRectF *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  QPainterPath::arcTo((QRectF *)&local_70,90.0,-90.0);
  QPainterPath::lineTo
            ((QPainterPath *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
             (qreal)in_stack_fffffffffffffd10,(qreal)in_stack_fffffffffffffd08);
  QRect::QRect(in_stack_fffffffffffffd08,(int)((ulong)in_stack_fffffffffffffd00 >> 0x20),
               (int)in_stack_fffffffffffffd00,in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8);
  QRectF::QRectF((QRectF *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  QPainterPath::arcTo((QRectF *)&local_70,0.0,-90.0);
  if ((bVar1) || (bVar2)) {
    if ((!bVar1) && (bVar2)) {
      if (bVar3 != 0) {
        QPainterPath::lineTo
                  ((QPainterPath *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                   (qreal)in_stack_fffffffffffffd10,(qreal)in_stack_fffffffffffffd08);
        QPainterPath::lineTo
                  ((QPainterPath *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                   (qreal)in_stack_fffffffffffffd10,(qreal)in_stack_fffffffffffffd08);
        QPainterPath::lineTo
                  ((QPainterPath *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                   (qreal)in_stack_fffffffffffffd10,(qreal)in_stack_fffffffffffffd08);
      }
      local_110.data._4_4_ = QPoint::x((QPoint *)0x490c92);
      local_110.data._4_4_ = local_110.data._4_4_ + -0x12;
      local_110.data._0_4_ = QRect::x((QRect *)0x490ca9);
      local_110.data._0_4_ = (int)local_110.data + 2;
      qMax<int>((int *)((long)&local_110.data + 4),(int *)&local_110.data);
      QPoint::y((QPoint *)0x490cde);
      QSize::height((QSize *)0x490cf2);
      QWidget::move(in_stack_fffffffffffffd10,(int)((ulong)in_stack_fffffffffffffd08 >> 0x20),
                    (int)in_stack_fffffffffffffd08);
    }
  }
  else {
    if (bVar3 != 0) {
      QPainterPath::lineTo
                ((QPainterPath *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                 (qreal)in_stack_fffffffffffffd10,(qreal)in_stack_fffffffffffffd08);
      QPainterPath::lineTo
                ((QPainterPath *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                 (qreal)in_stack_fffffffffffffd10,(qreal)in_stack_fffffffffffffd08);
      QPainterPath::lineTo
                ((QPainterPath *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                 (qreal)in_stack_fffffffffffffd10,(qreal)in_stack_fffffffffffffd08);
    }
    iVar4 = QPoint::x((QPoint *)0x490b40);
    iVar5 = QSize::width((QSize *)0x490b54);
    local_e4[0] = (iVar4 - iVar5) + 0x12;
    iVar4 = QRect::right((QRect *)0x490b76);
    iVar5 = QSize::width((QSize *)0x490b8a);
    local_e8 = (iVar4 - iVar5) + -2;
    qMin<int>(local_e4,&local_e8);
    QPoint::y((QPoint *)0x490bca);
    QSize::height((QSize *)0x490bde);
    QWidget::move(in_stack_fffffffffffffd10,(int)((ulong)in_stack_fffffffffffffd08 >> 0x20),
                  (int)in_stack_fffffffffffffd08);
  }
  QPainterPath::lineTo
            ((QPainterPath *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
             (qreal)in_stack_fffffffffffffd10,(qreal)in_stack_fffffffffffffd08);
  duration.__r = (rep)&local_120;
  uVar10 = 0xe;
  QRect::QRect((QRect *)duration.__r,(int)((ulong)in_stack_fffffffffffffd00 >> 0x20),
               (int)in_stack_fffffffffffffd00,in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8);
  this_01 = &local_110;
  QRectF::QRectF((QRectF *)this_01,(QRect *)duration.__r);
  QPainterPath::arcTo((QRectF *)&local_70,-90.0,-90.0);
  QPainterPath::lineTo
            ((QPainterPath *)CONCAT44(uVar10,in_stack_fffffffffffffd18),(qreal)this_01,
             (qreal)duration.__r);
  QRect::QRect((QRect *)duration.__r,(int)((ulong)in_stack_fffffffffffffd00 >> 0x20),
               (int)in_stack_fffffffffffffd00,in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8);
  QRectF::QRectF((QRectF *)this_01,(QRect *)duration.__r);
  QPainterPath::arcTo((QRectF *)&local_70,180.0,-90.0);
  local_158 = &DAT_aaaaaaaaaaaaaaaa;
  local_168 = 0xaaaaaaaa;
  uStack_164 = 0xaaaaaaaa;
  uStack_160 = 0xaaaaaaaa;
  uStack_15c = 0xaaaaaaaa;
  local_170 = (**(code **)(*in_RDI + 0x70))();
  QBitmap::QBitmap((QBitmap *)&local_168,(QSize *)&local_170);
  QColor::QColor(&local_18,color0);
  QPixmap::fill((QColor *)&local_168);
  local_178 = &DAT_aaaaaaaaaaaaaaaa;
  QPainter::QPainter((QPainter *)&local_178,(QPaintDevice *)&local_168);
  QBrush::QBrush(local_188,color1,SolidPattern);
  QPen::QPen(local_180,local_188,1.0,SolidLine,SquareCap,BevelJoin);
  QPainter::setPen((QPen *)&local_178);
  QPen::~QPen(local_180);
  QBrush::~QBrush(local_188);
  QBrush::QBrush(local_190,color1,SolidPattern);
  QPainter::setBrush((QBrush *)&local_178);
  QBrush::~QBrush(local_190);
  QPainter::drawPath((QPainterPath *)&local_178);
  QWidget::setMask(this_01,(QBitmap *)duration.__r);
  QPixmap::QPixmap(local_1a8,(QSize *)&local_64);
  QPixmap::operator=((QPixmap *)duration.__r,(QPixmap *)in_stack_fffffffffffffd00);
  QPixmap::~QPixmap(local_1a8);
  local_1b0 = &DAT_aaaaaaaaaaaaaaaa;
  QPainter::QPainter((QPainter *)&local_1b0,(QPaintDevice *)(in_RDI + 6));
  QWidget::palette(in_stack_fffffffffffffd00);
  pQVar8 = QPalette::color((QPalette *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcfc);
  auVar9 = QColor::darker((int)pQVar8);
  local_28 = auVar9._0_8_;
  local_1c8 = auVar9._8_4_;
  local_20 = local_1c8;
  uStack_1c4 = auVar9._12_2_;
  local_1c = uStack_1c4;
  QBrush::QBrush(local_1c0,(QColor *)&local_28,SolidPattern);
  QPen::QPen(local_1b8,local_1c0,1.0,SolidLine,SquareCap,BevelJoin);
  QPainter::setPen((QPen *)&local_1b0);
  QPen::~QPen(local_1b8);
  QBrush::~QBrush(local_1c0);
  QWidget::palette(in_stack_fffffffffffffd00);
  pQVar8 = QPalette::color((QPalette *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcfc);
  local_38 = *(undefined8 *)pQVar8;
  local_30 = *(undefined8 *)((long)&pQVar8->ct + 4);
  QPainter::setBrush((QColor *)&local_1b0);
  QPainter::drawPath((QPainterPath *)&local_1b0);
  if (0 < local_3c) {
    this_00 = (duration<long,_std::ratio<1L,_1000000000L>_> *)(in_RDI + 9);
    ms<(char)49>();
    std::chrono::operator*
              ((int *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),
               (duration<long,_std::ratio<1L,_1000L>_> *)0x491170);
    std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,std::ratio<1l,1000l>,void>
              (this_00,(duration<long,_std::ratio<1L,_1000L>_> *)
                       CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
    QBasicTimer::start((QBasicTimer *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),
                       duration,(QObject *)0x4911a7);
  }
  QWidget::show(this_01);
  QPainter::~QPainter((QPainter *)&local_1b0);
  QPainter::~QPainter((QPainter *)&local_178);
  QBitmap::~QBitmap((QBitmap *)&local_168);
  QPainterPath::~QPainterPath((QPainterPath *)&local_70);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QBalloonTip::balloon(const QPoint& pos, int msecs, bool showArrow)
{
    this->showArrow = showArrow;
    QScreen *screen = QGuiApplication::screenAt(pos);
    if (!screen)
        screen = QGuiApplication::primaryScreen();
    QRect screenRect = screen->geometry();
    QSize sh = sizeHint();
    const int border = 1;
    const int ah = 18, ao = 18, aw = 18, rc = 7;
    bool arrowAtTop = (pos.y() + sh.height() + ah < screenRect.height());
    bool arrowAtLeft = (pos.x() + sh.width() - ao < screenRect.width());
    setContentsMargins(border + 3,  border + (arrowAtTop ? ah : 0) + 2, border + 3, border + (arrowAtTop ? 0 : ah) + 2);
    updateGeometry();
    sh  = sizeHint();

    int ml, mr, mt, mb;
    QSize sz = sizeHint();
    if (!arrowAtTop) {
        ml = mt = 0;
        mr = sz.width() - 1;
        mb = sz.height() - ah - 1;
    } else {
        ml = 0;
        mt = ah;
        mr = sz.width() - 1;
        mb = sz.height() - 1;
    }

    QPainterPath path;
    path.moveTo(ml + rc, mt);
    if (arrowAtTop && arrowAtLeft) {
        if (showArrow) {
            path.lineTo(ml + ao, mt);
            path.lineTo(ml + ao, mt - ah);
            path.lineTo(ml + ao + aw, mt);
        }
        move(qMax(pos.x() - ao, screenRect.left() + 2), pos.y());
    } else if (arrowAtTop && !arrowAtLeft) {
        if (showArrow) {
            path.lineTo(mr - ao - aw, mt);
            path.lineTo(mr - ao, mt - ah);
            path.lineTo(mr - ao, mt);
        }
        move(qMin(pos.x() - sh.width() + ao, screenRect.right() - sh.width() - 2), pos.y());
    }
    path.lineTo(mr - rc, mt);
    path.arcTo(QRect(mr - rc*2, mt, rc*2, rc*2), 90, -90);
    path.lineTo(mr, mb - rc);
    path.arcTo(QRect(mr - rc*2, mb - rc*2, rc*2, rc*2), 0, -90);
    if (!arrowAtTop && !arrowAtLeft) {
        if (showArrow) {
            path.lineTo(mr - ao, mb);
            path.lineTo(mr - ao, mb + ah);
            path.lineTo(mr - ao - aw, mb);
        }
        move(qMin(pos.x() - sh.width() + ao, screenRect.right() - sh.width() - 2),
             pos.y() - sh.height());
    } else if (!arrowAtTop && arrowAtLeft) {
        if (showArrow) {
            path.lineTo(ao + aw, mb);
            path.lineTo(ao, mb + ah);
            path.lineTo(ao, mb);
        }
        move(qMax(pos.x() - ao, screenRect.x() + 2), pos.y() - sh.height());
    }
    path.lineTo(ml + rc, mb);
    path.arcTo(QRect(ml, mb - rc*2, rc*2, rc*2), -90, -90);
    path.lineTo(ml, mt + rc);
    path.arcTo(QRect(ml, mt, rc*2, rc*2), 180, -90);

    // Set the mask
    QBitmap bitmap = QBitmap(sizeHint());
    bitmap.fill(Qt::color0);
    QPainter painter1(&bitmap);
    painter1.setPen(QPen(Qt::color1, border));
    painter1.setBrush(QBrush(Qt::color1));
    painter1.drawPath(path);
    setMask(bitmap);

    // Draw the border
    pixmap = QPixmap(sz);
    QPainter painter2(&pixmap);
    painter2.setPen(QPen(palette().color(QPalette::Window).darker(160), border));
    painter2.setBrush(palette().color(QPalette::Window));
    painter2.drawPath(path);

    if (msecs > 0)
        timer.start(msecs * 1ms, this);
    show();
}